

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O2

void duckdb_zstd::ZSTD_overflowCorrectIfNeeded
               (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *ip,void *iend)

{
  BYTE **ppBVar1;
  ZSTD_strategy ZVar2;
  BYTE *pBVar3;
  U32 UVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  U32 *pUVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  
  pBVar3 = (ms->window).base;
  iVar6 = (int)pBVar3;
  if (0xe0000000 < (uint)((int)iend - iVar6)) {
    uVar7 = 1 << ((byte)(params->cParams).windowLog & 0x1f);
    uVar9 = 1 << ((char)(params->cParams).chainLog - (ZSTD_lazy2 < (params->cParams).strategy) &
                 0x1fU);
    uVar17 = (int)ip - iVar6;
    uVar11 = uVar9 - 1 & uVar17;
    uVar13 = 2;
    uVar8 = uVar13;
    if (2 < uVar9) {
      uVar8 = uVar9;
    }
    uVar15 = 0;
    if (uVar11 < 2) {
      uVar15 = uVar8;
    }
    if (uVar9 <= uVar7) {
      uVar9 = uVar7;
    }
    uVar17 = uVar17 - (uVar9 + uVar11 + uVar15);
    (ms->window).base = pBVar3 + uVar17;
    ppBVar1 = &(ms->window).dictBase;
    *ppBVar1 = *ppBVar1 + uVar17;
    uVar9 = (ms->window).lowLimit;
    uVar7 = uVar17 + 2;
    uVar8 = uVar9 - uVar17;
    if (uVar9 < uVar7) {
      uVar8 = uVar13;
    }
    uVar9 = (ms->window).dictLimit;
    (ms->window).lowLimit = uVar8;
    uVar8 = uVar9 - uVar17;
    if (uVar9 < uVar7) {
      uVar8 = uVar13;
    }
    (ms->window).dictLimit = uVar8;
    pUVar12 = &(ms->window).nbOverflowCorrections;
    *pUVar12 = *pUVar12 + 1;
    ws->tableValidEnd = ws->objectEnd;
    ZSTD_reduceTable(ms->hashTable,1 << ((byte)(params->cParams).hashLog & 0x1f),uVar17);
    ZVar2 = (params->cParams).strategy;
    if ((ms->dedicatedDictSearch != 0) ||
       ((ZVar2 != ZSTD_fast &&
        ((2 < ZVar2 - ZSTD_greedy || (params->useRowMatchFinder != ZSTD_ps_enable)))))) {
      UVar4 = 1 << ((byte)(params->cParams).chainLog & 0x1f);
      pUVar12 = ms->chainTable;
      if (ZVar2 == ZSTD_btlazy2) {
        iVar6 = 0x10;
        iVar5 = (int)UVar4 / 0x10;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
        lVar10 = 0;
        for (iVar14 = 0; iVar14 != iVar5; iVar14 = iVar14 + 1) {
          for (lVar16 = 0; iVar6 + lVar10 != lVar16; lVar16 = lVar16 + 1) {
            uVar9 = pUVar12[lVar16];
            UVar4 = uVar9 - uVar17;
            if (uVar9 < uVar7) {
              UVar4 = 0;
            }
            if (uVar9 == 1) {
              UVar4 = 1;
            }
            pUVar12[lVar16] = UVar4;
          }
          pUVar12 = pUVar12 + 0x10;
          lVar10 = lVar10 + -0x10;
          iVar6 = iVar6 + 0x10;
        }
      }
      else {
        ZSTD_reduceTable(pUVar12,UVar4,uVar17);
      }
    }
    if (ms->hashLog3 != 0) {
      ZSTD_reduceTable(ms->hashTable3,1 << ((byte)ms->hashLog3 & 0x1f),uVar17);
    }
    if (ws->tableValidEnd < ws->tableEnd) {
      ws->tableValidEnd = ws->tableEnd;
    }
    UVar4 = ms->nextToUpdate - uVar17;
    if (ms->nextToUpdate < uVar17) {
      UVar4 = 0;
    }
    ms->nextToUpdate = UVar4;
    ms->loadedDictEnd = 0;
    ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  }
  return;
}

Assistant:

static void ZSTD_overflowCorrectIfNeeded(ZSTD_matchState_t* ms,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         void const* ip,
                                         void const* iend)
{
    U32 const cycleLog = ZSTD_cycleLog(params->cParams.chainLog, params->cParams.strategy);
    U32 const maxDist = (U32)1 << params->cParams.windowLog;
    if (ZSTD_window_needOverflowCorrection(ms->window, cycleLog, maxDist, ms->loadedDictEnd, ip, iend)) {
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, maxDist, ip);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
        ZSTD_cwksp_mark_tables_dirty(ws);
        ZSTD_reduceIndex(ms, params, correction);
        ZSTD_cwksp_mark_tables_clean(ws);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        /* invalidate dictionaries on overflow correction */
        ms->loadedDictEnd = 0;
        ms->dictMatchState = NULL;
    }
}